

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

bool __thiscall Kernel::Clause::skip(Clause *this)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)((uint)*(undefined8 *)&this->field_0x38 & 0xfffff);
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar4 == uVar3) break;
    bVar2 = Term::skip(&this->_literals[uVar3]->super_Term);
    uVar1 = uVar3 + 1;
  } while (bVar2);
  return uVar4 <= uVar3;
}

Assistant:

bool Clause::skip() const
{
  unsigned clen = length();
  for(unsigned i = 0; i < clen; i++) {
    const Literal* lit = (*this)[i];
    if (!lit->skip()) {
      return false;
    }
  }
  return true;
}